

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

int InjectFlushOrPushOutput
              (BrotliEncoderStateInternal *s,size_t *available_out,uint8_t **next_out,
              size_t *total_out)

{
  size_t *in_RCX;
  long *in_RDX;
  ulong *in_RSI;
  BrotliEncoderStateInternal *in_RDI;
  size_t copy_output_size;
  size_t local_48;
  int local_14;
  
  if ((in_RDI->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED) && (in_RDI->last_bytes_bits_ != '\0')
     ) {
    InjectBytePaddingBlock(in_RDI);
    local_14 = 1;
  }
  else if ((in_RDI->available_out_ == 0) || (*in_RSI == 0)) {
    local_14 = 0;
  }
  else {
    local_48 = *in_RSI;
    if (in_RDI->available_out_ < local_48) {
      local_48 = in_RDI->available_out_;
    }
    memcpy((void *)*in_RDX,in_RDI->next_out_,local_48);
    *in_RDX = local_48 + *in_RDX;
    *in_RSI = *in_RSI - local_48;
    in_RDI->next_out_ = in_RDI->next_out_ + local_48;
    in_RDI->available_out_ = in_RDI->available_out_ - local_48;
    in_RDI->total_out_ = local_48 + in_RDI->total_out_;
    SetTotalOut(in_RDI,in_RCX);
    local_14 = 1;
  }
  return local_14;
}

Assistant:

static BROTLI_BOOL InjectFlushOrPushOutput(BrotliEncoderState* s,
    size_t* available_out, uint8_t** next_out, size_t* total_out) {
  if (s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED &&
      s->last_bytes_bits_ != 0) {
    InjectBytePaddingBlock(s);
    return BROTLI_TRUE;
  }

  if (s->available_out_ != 0 && *available_out != 0) {
    size_t copy_output_size =
        BROTLI_MIN(size_t, s->available_out_, *available_out);
    memcpy(*next_out, s->next_out_, copy_output_size);
    *next_out += copy_output_size;
    *available_out -= copy_output_size;
    s->next_out_ += copy_output_size;
    s->available_out_ -= copy_output_size;
    s->total_out_ += copy_output_size;
    SetTotalOut(s, total_out);
    return BROTLI_TRUE;
  }

  return BROTLI_FALSE;
}